

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PhyloTree.cpp
# Opt level: O2

void __thiscall PhyloTree::PhyloTree(PhyloTree *this,PhyloTree *t)

{
  std::__cxx11::string::string((string *)this,(string *)t);
  std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::vector(&this->edges,&t->edges);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->leaf2NumMap,&t->leaf2NumMap);
  std::vector<double,_std::allocator<double>_>::vector(&this->leafEdgeLengths,&t->leafEdgeLengths);
  return;
}

Assistant:

PhyloTree::PhyloTree(const PhyloTree &t) = default;